

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_9ab804::HandleReplaceFilenameCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  _List *path_00;
  bool bVar1;
  int iVar2;
  cmMakefile *pcVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  size_type sVar5;
  const_reference pvVar6;
  string *local_1c0;
  string local_178;
  string_view local_158;
  byte local_142;
  allocator<char> local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 local_100 [8];
  cmCMakePath path;
  string inputPath;
  string local_b0;
  undefined4 local_8c;
  undefined1 local_88 [8];
  OutputVariable arguments;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  if (((anonymous_namespace)::
       HandleReplaceFilenameCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleReplaceFilenameCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar2 != 0)) {
    ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>::
    ArgumentParserWithOutputVariable
              (&HandleReplaceFilenameCommand::parser.
                super_ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>);
    __cxa_atexit(OutputVariableParser::~OutputVariableParser,&HandleReplaceFilenameCommand::parser,
                 &__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HandleReplaceFilenameCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>::Parse<2>
            ((OutputVariable *)local_88,
             &HandleReplaceFilenameCommand::parser.
              super_ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>,args);
  pcVar3 = cmExecutionStatus::GetMakefile(status);
  bVar1 = ArgumentParser::ParseResult::MaybeReportError((ParseResult *)local_88,pcVar3);
  if (bVar1) {
    args_local._7_1_ = true;
    local_8c = 1;
  }
  else {
    pvVar4 = (anonymous_namespace)::CMakePathArgumentParser<(anonymous_namespace)::OutputVariable>::
             GetInputs_abi_cxx11_
                       ((CMakePathArgumentParser<(anonymous_namespace)::OutputVariable> *)
                        &HandleReplaceFilenameCommand::parser);
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(pvVar4);
    if (sVar5 < 2) {
      path_00 = &path.Path._M_cmpts;
      std::__cxx11::string::string((string *)path_00);
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,1);
      bVar1 = getInputPath(pvVar6,status,(string *)path_00);
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_120,(string *)&path.Path._M_cmpts);
        cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                  ((cmCMakePath *)local_100,&local_120,generic_format);
        std::__cxx11::string::~string((string *)&local_120);
        pvVar4 = (anonymous_namespace)::
                 CMakePathArgumentParser<(anonymous_namespace)::OutputVariable>::
                 GetInputs_abi_cxx11_
                           ((CMakePathArgumentParser<(anonymous_namespace)::OutputVariable> *)
                            &HandleReplaceFilenameCommand::parser);
        bVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(pvVar4);
        local_142 = 0;
        if (bVar1) {
          std::allocator<char>::allocator();
          local_142 = 1;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"",&local_141);
        }
        else {
          pvVar4 = (anonymous_namespace)::
                   CMakePathArgumentParser<(anonymous_namespace)::OutputVariable>::
                   GetInputs_abi_cxx11_
                             ((CMakePathArgumentParser<(anonymous_namespace)::OutputVariable> *)
                              &HandleReplaceFilenameCommand::parser);
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::front(pvVar4);
          std::__cxx11::string::string((string *)&local_140,(string *)pvVar6);
        }
        cmCMakePath::ReplaceFileName<std::__cxx11::string,cmCMakePath&>
                  ((cmCMakePath *)local_100,&local_140);
        std::__cxx11::string::~string((string *)&local_140);
        if ((local_142 & 1) != 0) {
          std::allocator<char>::~allocator(&local_141);
        }
        pcVar3 = cmExecutionStatus::GetMakefile(status);
        bVar1 = std::optional::operator_cast_to_bool
                          ((optional *)
                           &arguments.super_ParseResult.KeywordErrors._M_t._M_impl.
                            super__Rb_tree_header._M_node_count);
        if (bVar1) {
          local_1c0 = &std::
                       optional<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator*((optional<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&arguments.super_ParseResult.KeywordErrors._M_t._M_impl.
                                       super__Rb_tree_header._M_node_count)->
                       super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>;
        }
        else {
          local_1c0 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[](args,1);
        }
        cmCMakePath::String_abi_cxx11_(&local_178,(cmCMakePath *)local_100);
        local_158 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_178);
        cmMakefile::AddDefinition(pcVar3,local_1c0,local_158);
        std::__cxx11::string::~string((string *)&local_178);
        args_local._7_1_ = true;
        local_8c = 1;
        cmCMakePath::~cmCMakePath((cmCMakePath *)local_100);
      }
      else {
        args_local._7_1_ = false;
        local_8c = 1;
      }
      std::__cxx11::string::~string((string *)&path.Path._M_cmpts);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"REPLACE_FILENAME called with unexpected arguments.",
                 (allocator<char> *)(inputPath.field_2._M_local_buf + 0xf));
      cmExecutionStatus::SetError(status,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator((allocator<char> *)(inputPath.field_2._M_local_buf + 0xf));
      args_local._7_1_ = false;
      local_8c = 1;
    }
  }
  OutputVariable::~OutputVariable((OutputVariable *)local_88);
  return args_local._7_1_;
}

Assistant:

bool HandleReplaceFilenameCommand(std::vector<std::string> const& args,
                                  cmExecutionStatus& status)
{
  static OutputVariableParser const parser{};

  const auto arguments = parser.Parse(args);

  if (arguments.MaybeReportError(status.GetMakefile())) {
    return true;
  }

  if (parser.GetInputs().size() > 1) {
    status.SetError("REPLACE_FILENAME called with unexpected arguments.");
    return false;
  }

  std::string inputPath;
  if (!getInputPath(args[1], status, inputPath)) {
    return false;
  }

  cmCMakePath path(inputPath);
  path.ReplaceFileName(
    parser.GetInputs().empty() ? "" : parser.GetInputs().front());

  status.GetMakefile().AddDefinition(
    arguments.Output ? *arguments.Output : args[1], path.String());

  return true;
}